

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::setupChannelData(DwaCompressor *this,int minX,int minY,int maxX,int maxY)

{
  pointer pCVar1;
  char *pcVar2;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  char *planarUncBuffer [3];
  
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    planarUncBuffer[lVar6] = this->_planarUncBuffer[lVar6];
  }
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    pCVar1 = (this->_channelData).
             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_channelData).
                       super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x98) <= uVar8)
    break;
    iVar3 = numSamples(pCVar1[uVar8].xSampling,minX,maxX);
    pCVar1[uVar8].width = iVar3;
    iVar4 = numSamples(pCVar1[uVar8].ySampling,minY,maxY);
    pCVar1[uVar8].height = iVar4;
    iVar3 = pCVar1[uVar8].width;
    iVar5 = pixelTypeSize(pCVar1[uVar8].type);
    pCVar1[uVar8].planarUncSize = iVar5 * iVar4 * iVar3;
    pcVar2 = planarUncBuffer[pCVar1[uVar8].compression];
    pCVar1[uVar8].planarUncBuffer = pcVar2;
    pCVar1[uVar8].planarUncBufferEnd = pcVar2;
    pCVar1[uVar8].planarUncRle[0] = pcVar2;
    pCVar1[uVar8].planarUncRleEnd[0] = pcVar2;
    lVar6 = 10;
    while( true ) {
      iVar3 = pixelTypeSize(pCVar1[uVar8].type);
      if ((long)iVar3 <= lVar6 + -9) break;
      iVar3 = pCVar1[uVar8].width;
      iVar4 = pCVar1[uVar8].height;
      pcVar2 = pCVar1[uVar8].planarUncRle[lVar6 + -10];
      pCVar1[uVar8].planarUncRle[lVar6 + -9] = pcVar2 + (long)iVar4 * (long)iVar3;
      pCVar1[uVar8].planarUncRle[lVar6 + -5] = pcVar2 + (long)iVar4 * (long)iVar3;
      lVar6 = lVar6 + 1;
    }
    pCVar1[uVar8].planarUncType = pCVar1[uVar8].type;
    if (pCVar1[uVar8].compression == LOSSY_DCT) {
      pCVar1[uVar8].planarUncType = FLOAT;
    }
    else {
      iVar3 = pCVar1[uVar8].height;
      iVar4 = pCVar1[uVar8].width;
      iVar5 = pixelTypeSize(pCVar1[uVar8].type);
      planarUncBuffer[pCVar1[uVar8].compression] =
           planarUncBuffer[pCVar1[uVar8].compression] + iVar5 * iVar3 * iVar4;
    }
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void
DwaCompressor::setupChannelData (int minX, int minY, int maxX, int maxY)
{
    char *planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (_planarUncBuffer[i])
            planarUncBuffer[i] =  _planarUncBuffer[i];
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        cd->width  = OPENEXR_IMF_NAMESPACE::numSamples (cd->xSampling, minX, maxX);
        cd->height = OPENEXR_IMF_NAMESPACE::numSamples (cd->ySampling, minY, maxY);
                                
        cd->planarUncSize =
            cd->width * cd->height * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                                  
        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type); ++byte)
        {
            cd->planarUncRle[byte] = 
                         cd->planarUncRle[byte-1] + cd->width * cd->height;

            cd->planarUncRleEnd[byte] =
                         cd->planarUncRle[byte];
        }

        cd->planarUncType = cd->type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = FLOAT;
        }
        else
        {
            planarUncBuffer[cd->compression] +=
                cd->width * cd->height * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->planarUncType);
        }
    }
}